

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O2

parser_error parse_prefs_gf(parser *p)

{
  char cVar1;
  wchar_t wVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *str;
  _Bool *p_Var6;
  long lVar7;
  long lStack_80;
  _Bool types [62];
  
  p_Var6 = types;
  types[0x30] = false;
  types[0x31] = false;
  types[0x32] = false;
  types[0x33] = false;
  types[0x34] = false;
  types[0x35] = false;
  types[0x36] = false;
  types[0x37] = false;
  types[0x38] = false;
  types[0x39] = false;
  types[0x3a] = false;
  types[0x3b] = false;
  types[0x3c] = false;
  types[0x3d] = false;
  types[0x20] = false;
  types[0x21] = false;
  types[0x22] = false;
  types[0x23] = false;
  types[0x24] = false;
  types[0x25] = false;
  types[0x26] = false;
  types[0x27] = false;
  types[0x28] = false;
  types[0x29] = false;
  types[0x2a] = false;
  types[0x2b] = false;
  types[0x2c] = false;
  types[0x2d] = false;
  types[0x2e] = false;
  types[0x2f] = false;
  types[0x10] = false;
  types[0x11] = false;
  types[0x12] = false;
  types[0x13] = false;
  types[0x14] = false;
  types[0x15] = false;
  types[0x16] = false;
  types[0x17] = false;
  types[0x18] = false;
  types[0x19] = false;
  types[0x1a] = false;
  types[0x1b] = false;
  types[0x1c] = false;
  types[0x1d] = false;
  types[0x1e] = false;
  types[0x1f] = false;
  types[0] = false;
  types[1] = false;
  types[2] = false;
  types[3] = false;
  types[4] = false;
  types[5] = false;
  types[6] = false;
  types[7] = false;
  types[8] = false;
  types[9] = false;
  types[10] = false;
  types[0xb] = false;
  types[0xc] = false;
  types[0xd] = false;
  types[0xe] = false;
  types[0xf] = false;
  pcVar5 = (char *)parser_priv(p);
  if (pcVar5 == (char *)0x0) {
    __assert_fail("d != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-prefs.c"
                  ,0x351,"enum parser_error parse_prefs_gf(struct parser *)");
  }
  if (*pcVar5 != '\0') {
    return PARSE_ERROR_NONE;
  }
  pcVar5 = parser_getsym(p,"type");
  str = string_make(pcVar5);
  pcVar5 = str;
  while (pcVar5 = strtok(pcVar5,"| "), pcVar5 != (char *)0x0) {
    if ((*pcVar5 == '*') && (pcVar5[1] == '\0')) {
      types[0] = true;
      types[1] = true;
      types[2] = true;
      types[3] = true;
      types[4] = true;
      types[5] = true;
      types[6] = true;
      types[7] = true;
      types[8] = true;
      types[9] = true;
      types[10] = true;
      types[0xb] = true;
      types[0xc] = true;
      types[0xd] = true;
      types[0xe] = true;
      types[0xf] = true;
      types[0x30] = true;
      types[0x31] = true;
      types[0x32] = true;
      types[0x33] = true;
      types[0x34] = true;
      types[0x35] = true;
      types[0x28] = true;
      types[0x29] = true;
      types[0x2a] = true;
      types[0x2b] = true;
      types[0x2c] = true;
      types[0x2d] = true;
      types[0x2e] = true;
      types[0x2f] = true;
      pcVar5 = (char *)0x0;
      types._16_8_ = types._0_8_;
      types._24_8_ = types._8_8_;
      types._32_8_ = types._0_8_;
      types._54_8_ = types._8_8_;
    }
    else {
      wVar2 = proj_name_to_idx(pcVar5);
      if (wVar2 == L'\xffffffff') {
        return PARSE_ERROR_INVALID_VALUE;
      }
      types[wVar2] = true;
      pcVar5 = (char *)0x0;
    }
  }
  string_free(str);
  pcVar5 = parser_getsym(p,"direction");
  iVar3 = strcmp(pcVar5,"static");
  if (iVar3 == 0) {
    lStack_80 = 0;
  }
  else {
    cVar1 = *pcVar5;
    if (cVar1 == '9') {
      if ((pcVar5[1] == '0') && (pcVar5[2] == '\0')) {
        lStack_80 = 3;
        goto LAB_001f2ac2;
      }
    }
    else if (cVar1 == '4') {
      if ((pcVar5[1] == '5') && (pcVar5[2] == '\0')) {
        lStack_80 = 2;
        goto LAB_001f2ac2;
      }
    }
    else if ((cVar1 == '0') && (pcVar5[1] == '\0')) {
      lStack_80 = 1;
      goto LAB_001f2ac2;
    }
    iVar3 = strcmp(pcVar5,"135");
    if (iVar3 != 0) {
      return PARSE_ERROR_INVALID_VALUE;
    }
    lStack_80 = 4;
  }
LAB_001f2ac2:
  for (lVar7 = 0; lVar7 != 0x136; lVar7 = lVar7 + 5) {
    if (*p_Var6 == true) {
      uVar4 = parser_getuint(p,"attr");
      proj_to_attr[0][lVar7 + lStack_80] = (uint8_t)uVar4;
      uVar4 = parser_getuint(p,"char");
      *(uint *)((long)proj_to_char[0] + lVar7 * 4 + (ulong)(uint)((int)lStack_80 * 4)) = uVar4;
    }
    p_Var6 = p_Var6 + 1;
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_prefs_gf(struct parser *p)
{
	bool types[PROJ_MAX] = { 0 };
	const char *direction;
	int motion;

	char *s, *t;

	size_t i;

	struct prefs_data *d = parser_priv(p);
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	/* Parse the type, which is a | separated list of PROJ_ constants */
	s = string_make(parser_getsym(p, "type"));
	t = strtok(s, "| ");
	while (t) {
		if (streq(t, "*")) {
			memset(types, true, sizeof types);
		} else {
			int idx = proj_name_to_idx(t);
			if (idx == -1)
				return PARSE_ERROR_INVALID_VALUE;

			types[idx] = true;
		}

		t = strtok(NULL, "| ");
	}

	string_free(s);

	direction = parser_getsym(p, "direction");
	if (streq(direction, "static"))
		motion = BOLT_NO_MOTION;
	else if (streq(direction, "0"))
		motion = BOLT_0;
	else if (streq(direction, "45"))
		motion = BOLT_45;
	else if (streq(direction, "90"))
		motion = BOLT_90;
	else if (streq(direction, "135"))
		motion = BOLT_135;
	else
		return PARSE_ERROR_INVALID_VALUE;

	for (i = 0; i < PROJ_MAX; i++) {
		if (!types[i]) continue;

		proj_to_attr[i][motion] = (uint8_t)parser_getuint(p, "attr");
		proj_to_char[i][motion] = (wchar_t)parser_getuint(p, "char");
	}

	return PARSE_ERROR_NONE;
}